

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_SpawnShot2(FParser *this)

{
  double type;
  bool bVar1;
  AActor *ent;
  FSoundID local_74;
  DVector3 local_70;
  AActor *local_58;
  AActor *mo;
  svalue_t local_40;
  double local_28;
  double z;
  PClassActor *pclass;
  AActor *source;
  FParser *this_local;
  
  pclass = (PClassActor *)0x0;
  local_28 = 0.0;
  source = (AActor *)this;
  bVar1 = CheckArgs(this,2);
  if (bVar1) {
    if ((this->t_argv[1].type == 1) && (this->t_argv[1].value.i < 0)) {
      pclass = (PClassActor *)::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->Script->trigger)
      ;
    }
    else {
      pclass = (PClassActor *)actorvalue(this->t_argv + 1);
    }
    if (2 < this->t_argc) {
      local_28 = floatvalue(this->t_argv + 2);
    }
    if (pclass != (PClassActor *)0x0) {
      svalue_t::svalue_t(&local_40,this->t_argv);
      z = (double)T_GetMobjType(&local_40);
      bVar1 = (PClassActor *)z != (PClassActor *)0x0;
      svalue_t::~svalue_t(&local_40);
      type = z;
      if (bVar1) {
        (this->t_return).type = 2;
        AActor::PosPlusZ(&local_70,(AActor *)pclass,local_28);
        ent = Spawn((PClassActor *)type,&local_70,ALLOW_REPLACE);
        local_58 = ent;
        if (ent != (AActor *)0x0) {
          FSoundID::FSoundID(&local_74,&(ent->SeeSound).super_FSoundID);
          S_Sound(ent,2,&local_74,1.0,1.0);
          TObjPtr<AActor>::operator=(&local_58->target,(AActor *)pclass);
          TAngle<double>::operator=
                    (&(local_58->Angles).Yaw,
                     (TAngle<double> *)&(pclass->super_PClass).super_PStruct.Fields);
          AActor::Thrust(local_58);
          bVar1 = P_CheckMissileSpawn(local_58,*(double *)&pclass->WoundHealth);
          if (!bVar1) {
            local_58 = (AActor *)0x0;
          }
        }
        (this->t_return).value.mobj = local_58;
      }
    }
  }
  return;
}

Assistant:

void FParser::SF_SpawnShot2(void)
{
	AActor *source = NULL;
	PClassActor * pclass;
	double z = 0;

	// t_argv[0] = type to spawn
	// t_argv[1] = source mobj, optional, -1 to default
	// shoots at source's angle

	if (CheckArgs(2))
	{
		if (t_argv[1].type == svt_int && t_argv[1].value.i < 0)
			source = Script->trigger;
		else
			source = actorvalue(t_argv[1]);

		if (t_argc > 2) z = floatvalue(t_argv[2]);

		if (!source)	return;

		if (!(pclass = T_GetMobjType(t_argv[0]))) return;

		t_return.type = svt_mobj;

		AActor *mo = Spawn(pclass, source->PosPlusZ(z), ALLOW_REPLACE);
		if (mo)
		{
			S_Sound(mo, CHAN_VOICE, mo->SeeSound, 1, ATTN_NORM);
			mo->target = source;
			mo->Angles.Yaw = source->Angles.Yaw;
			mo->Thrust();
			if (!P_CheckMissileSpawn(mo, source->radius)) mo = NULL;
		}
		t_return.value.mobj = mo;
	}
}